

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

BOOL __thiscall
Js::ModuleRoot::SetProperty
          (ModuleRoot *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  PropertyOperationFlags flags_00;
  int iVar1;
  BOOL BVar2;
  ScriptContext *scriptContext;
  HostObjectBase **ppHVar3;
  RecyclableObject *this_00;
  HostObjectBase *pHVar4;
  JavascriptLibrary *this_01;
  BOOL local_4c;
  GlobalObject *pGStack_48;
  BOOL setAttempted;
  GlobalObject *globalObj;
  PropertyValueInfo *pPStack_38;
  PropertyIndex index;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  ModuleRoot *pMStack_18;
  PropertyId propertyId_local;
  ModuleRoot *this_local;
  
  pPStack_38 = info;
  info_local._4_4_ = flags;
  pvStack_28 = value;
  value_local._4_4_ = propertyId;
  pMStack_18 = this;
  globalObj._6_2_ = DynamicObject::GetPropertyIndex((DynamicObject *)this,propertyId);
  if (globalObj._6_2_ == 0xffff) {
    ppHVar3 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar3 != (HostObjectBase *)0x0) {
      this_00 = (RecyclableObject *)
                Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                          (&(this->super_RootObjectBase).hostObject);
      BVar2 = RecyclableObject::HasProperty(this_00,value_local._4_4_);
      if (BVar2 != 0) {
        pHVar4 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                           (&(this->super_RootObjectBase).hostObject);
        BVar2 = (**(code **)(*(long *)pHVar4 + 0xb8))
                          (pHVar4,value_local._4_4_,pvStack_28,info_local._4_4_,0);
        return BVar2;
      }
    }
    this_01 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    pGStack_48 = JavascriptLibrary::GetGlobalObject(this_01);
    local_4c = 1;
    BVar2 = GlobalObject::SetExistingProperty
                      (pGStack_48,value_local._4_4_,pvStack_28,(PropertyValueInfo *)0x0,&local_4c);
    if (BVar2 == 0) {
      if (local_4c == 0) {
        this_local._4_4_ =
             DynamicObject::SetProperty
                       ((DynamicObject *)this,value_local._4_4_,pvStack_28,info_local._4_4_,
                        pPStack_38);
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    iVar1 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x30])(this,(ulong)value_local._4_4_);
    flags_00 = info_local._4_4_;
    if (iVar1 == 0) {
      scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      JavascriptError::ThrowCantAssignIfStrictMode(flags_00,scriptContext);
      iVar1 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x23])(this,(ulong)value_local._4_4_);
      if (iVar1 == 0) {
        PropertyValueInfo::Set
                  (pPStack_38,(RecyclableObject *)this,globalObj._6_2_,'\0',InlineCacheNoFlags);
      }
      else {
        PropertyValueInfo::SetNoCache(pPStack_38,(RecyclableObject *)this);
      }
      this_local._4_4_ = 0;
    }
    else {
      DynamicObject::SetSlot
                ((DynamicObject *)this,value_local._4_4_,false,(uint)globalObj._6_2_,pvStack_28);
      iVar1 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x23])(this,(ulong)value_local._4_4_);
      if (iVar1 == 0) {
        PropertyValueInfo::Set
                  (pPStack_38,(RecyclableObject *)this,globalObj._6_2_,'\x04',InlineCacheNoFlags);
      }
      else {
        PropertyValueInfo::SetNoCache(pPStack_38,(RecyclableObject *)this);
      }
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL ModuleRoot::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PropertyIndex index = GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            if (this->IsWritable(propertyId) == FALSE)
            {
                JavascriptError::ThrowCantAssignIfStrictMode(flags, this->GetScriptContext());

#if ENABLE_FIXED_FIELDS
                if (this->IsFixedProperty(propertyId))
                {
                    PropertyValueInfo::SetNoCache(info, this);
                }
                else
#endif
                {
                    PropertyValueInfo::Set(info, this, index, PropertyNone); // Try to cache property info even if not writable
                }
                return FALSE;
            }
            this->SetSlot(SetSlotArguments(propertyId, index, value));
#if ENABLE_FIXED_FIELDS
            if (this->IsFixedProperty(propertyId))
            {
                PropertyValueInfo::SetNoCache(info, this);
            }
            else
#endif
            {
                PropertyValueInfo::Set(info, this, index);
            }
            return TRUE;
        }
        else if (this->hostObject && this->hostObject->HasProperty(propertyId))
        {
            return this->hostObject->SetProperty(propertyId, value, flags, NULL);
        }

        //
        // Try checking the global object
        // if the module root doesn't have the property and the host object also doesn't have it
        //
        GlobalObject* globalObj = this->GetLibrary()->GetGlobalObject();
        BOOL setAttempted = TRUE;
        if (globalObj->SetExistingProperty(propertyId, value, NULL, &setAttempted))
        {
            return TRUE;
        }

        //
        // Set was attempted. But the set operation returned false.
        // This happens, when the property is read only.
        // In those scenarios, we should be setting the property with default attributes
        //
        if (setAttempted)
        {
            return FALSE;
        }

        return DynamicObject::SetProperty(propertyId, value, flags, info);
    }